

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O2

void booster::locale::impl::ios_prop<propery>::callback(event ev,ios_base *ios,int id)

{
  bool bVar1;
  void **ppvVar2;
  undefined4 *puVar3;
  
  if (ev == copyfmt_event) {
    ppvVar2 = std::ios_base::pword(ios,id);
    if (*ppvVar2 != (void *)0xffffffffffffffff) {
      ppvVar2 = std::ios_base::pword(ios,id);
      if (*ppvVar2 != (void *)0x0) {
        puVar3 = (undefined4 *)operator_new(4);
        ppvVar2 = std::ios_base::pword(ios,id);
        counter = counter + 1;
        *puVar3 = **ppvVar2;
        ppvVar2 = std::ios_base::pword(ios,id);
        *ppvVar2 = puVar3;
      }
    }
  }
  else if (ev == imbue_event) {
    ppvVar2 = std::ios_base::pword(ios,id);
    if (*ppvVar2 != (void *)0xffffffffffffffff) {
      ppvVar2 = std::ios_base::pword(ios,id);
      if (*ppvVar2 != (void *)0x0) {
        std::ios_base::pword(ios,id);
        imbued = imbued + 1;
      }
    }
  }
  else if (ev == erase_event) {
    bVar1 = has(ios);
    if (bVar1) {
      ppvVar2 = std::ios_base::pword(ios,id);
      if (*ppvVar2 != (void *)0x0) {
        counter = counter + -1;
      }
      operator_delete(*ppvVar2);
      return;
    }
  }
  return;
}

Assistant:

static void callback(std::ios_base::event ev,std::ios_base &ios,int id)
                {
                    switch(ev) {
                    case std::ios_base::erase_event:
                        if(!has(ios))
                            break;
                        delete reinterpret_cast<Property *>(ios.pword(id));
                        break;
                    case std::ios_base::copyfmt_event:
                        if(ios.pword(id)==invalid || ios.pword(id)==0)
                            break;
                        ios.pword(id)=new Property(*reinterpret_cast<Property *>(ios.pword(id)));
                        break;
                    case std::ios_base::imbue_event:
                        if(ios.pword(id)==invalid || ios.pword(id)==0)
                            break;
                        reinterpret_cast<Property *>(ios.pword(id))->on_imbue(); 
                        break;
                        
                    default: ;
                    }
                }